

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k054539.c
# Opt level: O1

void k054539_alloc_rom(void *chip,UINT32 memsize)

{
  uint uVar1;
  void *__s;
  k054539_state *info;
  
  if (*(UINT32 *)((long)chip + 0xb38) != memsize) {
    __s = realloc(*(void **)((long)chip + 0xb30),(ulong)memsize);
    *(void **)((long)chip + 0xb30) = __s;
    *(UINT32 *)((long)chip + 0xb38) = memsize;
    memset(__s,0xff,(ulong)memsize);
    if (memsize == 0) {
      uVar1 = 0;
    }
    else {
      uVar1 = memsize - 1 >> 1 | memsize - 1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      uVar1 = uVar1 >> 0x10 | uVar1;
    }
    *(uint *)((long)chip + 0xb3c) = uVar1;
  }
  return;
}

Assistant:

static void k054539_alloc_rom(void* chip, UINT32 memsize)
{
	k054539_state *info = (k054539_state *)chip;
	
	if (info->rom_size == memsize)
		return;
	
	info->rom = (UINT8*)realloc(info->rom, memsize);
	info->rom_size = memsize;
	memset(info->rom, 0xFF, memsize);
	
	info->rom_mask = pow2_mask(memsize);
	
	return;
}